

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

int ffvcks(fitsfile *fptr,int *datastatus,int *hdustatus,int *status)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  double dVar3;
  char comm [73];
  char chksum [71];
  unsigned_long olddatasum;
  unsigned_long hdusum;
  unsigned_long datasum;
  double tdouble;
  int tstatus;
  int *in_stack_ffffffffffffff30;
  unsigned_long *in_stack_ffffffffffffff38;
  unsigned_long *in_stack_ffffffffffffff40;
  fitsfile *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  char *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  long local_48;
  ulong local_40;
  int local_4;
  
  if (*in_RCX < 1) {
    *in_RSI = -1;
    *in_RDX = -1;
    iVar2 = *in_RCX;
    iVar1 = ffgkys(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   (char *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (iVar1 == 0xca) {
      *in_RDX = 0;
      *in_RCX = iVar2;
    }
    if (in_stack_ffffffffffffff68 == '\0') {
      *in_RDX = 0;
    }
    iVar1 = ffgkys(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   (char *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (iVar1 == 0xca) {
      *in_RSI = 0;
      *in_RCX = iVar2;
    }
    if (in_stack_ffffffffffffff68 == '\0') {
      *in_RSI = 0;
    }
    if ((*in_RCX < 1) && ((*in_RDX != 0 || (*in_RSI != 0)))) {
      dVar3 = atof(&stack0xffffffffffffff68);
      iVar2 = ffgcks(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
      if (iVar2 < 1) {
        if ((*in_RSI != 0) &&
           (local_40 == ((long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f))
           ) {
          *in_RSI = 1;
        }
        if ((*in_RDX != 0) && ((local_48 == 0 || (local_48 == 0xffffffff)))) {
          *in_RDX = 1;
        }
        local_4 = *in_RCX;
      }
      else {
        local_4 = *in_RCX;
      }
    }
    else {
      local_4 = *in_RCX;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffvcks(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *datastatus,     /* O - data checksum status               */
           int *hdustatus,      /* O - hdu checksum status                */
                                /*     1  verification is correct         */
                                /*     0  checksum keyword is not present */
                                /*    -1 verification not correct         */
           int *status)         /* IO - error status                      */
/*
    Verify the HDU by comparing the value of the computed checksums against
    the values of the DATASUM and CHECKSUM keywords if they are present.
*/
{
    int tstatus;
    double tdouble;
    unsigned long datasum, hdusum, olddatasum;
    char chksum[FLEN_VALUE], comm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *datastatus = -1;
    *hdustatus  = -1;

    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", chksum, comm, status) == KEY_NO_EXIST)
    {
        *hdustatus = 0;             /* CHECKSUM keyword does not exist */
        *status = tstatus;
    }
    if (chksum[0] == '\0')
        *hdustatus = 0;    /* all blank checksum means it is undefined */

    if (ffgkys(fptr, "DATASUM", chksum, comm, status) == KEY_NO_EXIST)
    {
        *datastatus = 0;            /* DATASUM keyword does not exist */
        *status = tstatus;
    }
    if (chksum[0] == '\0')
        *datastatus = 0;    /* all blank checksum means it is undefined */

    if ( *status > 0 || (!(*hdustatus) && !(*datastatus)) )
        return(*status);            /* return if neither keywords exist */

    /* convert string to unsigned long */

    /* olddatasum = strtoul(chksum, 0, 10);  doesn't work w/ gcc on SUN OS */
    /* sscanf(chksum, "%u", &olddatasum);   doesn't work w/ cc on VAX/VMS */

    tdouble = atof(chksum); /* read as a double as a workaround */
    olddatasum = (unsigned long) tdouble;

    /*  calculate the data checksum and the HDU checksum */
    if (ffgcks(fptr, &datasum, &hdusum, status) > 0)
        return(*status);

    if (*datastatus)
        if (datasum == olddatasum)
            *datastatus = 1;

    if (*hdustatus)
        if (hdusum == 0 || hdusum == 0xFFFFFFFF)
            *hdustatus = 1;

    return(*status);
}